

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

int QFileSystemEngine::mkdir(char *__path,__mode_t __mode)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  char *__path_00;
  long in_FS_OFFSET;
  bool result;
  mode_t mode;
  QByteArray path;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  undefined4 in_stack_ffffffffffffff78;
  mode_t __mode_00;
  undefined4 in_stack_ffffffffffffff7c;
  undefined1 local_6d;
  QFlagsStorage<QFileDevice::Permission> in_stack_ffffffffffffff9c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QFileSystemEntry::nativeFilePath
            ((QFileSystemEntry *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  bVar2 = QByteArray::isEmpty((QByteArray *)0x211d59);
  if (bVar2) {
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    local_6d = false;
  }
  else {
    bVar2 = qIsFilenameBroken((QByteArray *)0x211db3);
    if (bVar2) {
      piVar4 = __errno_location();
      *piVar4 = 0x16;
      local_6d = false;
    }
    else {
      bVar2 = std::optional::operator_cast_to_bool
                        ((optional<QFlags<QFileDevice::Permission>_> *)0x211e14);
      if (bVar2) {
        std::optional<QFlags<QFileDevice::Permission>_>::operator*
                  ((optional<QFlags<QFileDevice::Permission>_> *)0x211e27);
        __mode_00 = QtPrivate::toMode_t((Permissions)in_stack_ffffffffffffff9c.i);
      }
      else {
        __mode_00 = 0x1ff;
      }
      removeTrailingSlashes
                ((QByteArray *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      __path_00 = QByteArray::operator_cast_to_char_((QByteArray *)0x211e61);
      iVar3 = ::mkdir(__path_00,__mode_00);
      local_6d = iVar3 == 0;
    }
  }
  QByteArray::~QByteArray((QByteArray *)0x211e95);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_6d);
}

Assistant:

bool QFileSystemEngine::mkdir(const QFileSystemEntry &entry,
                              std::optional<QFile::Permissions> permissions)
{
    QByteArray path = entry.nativeFilePath();
    Q_CHECK_FILE_NAME(path, false);

    mode_t mode = permissions ? QtPrivate::toMode_t(*permissions) : 0777;
    auto result = QT_MKDIR(removeTrailingSlashes(path), mode) == 0;
#if defined(Q_OS_VXWORKS)
    if (result)
        forceRequestedPermissionsOnVxWorks(path, mode);
#endif
    return result;
}